

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> * __thiscall
ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>::operator<<
          (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *obj)

{
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *os;
  
  os = *(ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> **)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,16u,unsigned_char>
            (os,in_RDI);
  if (*(ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> **)(in_FS_OFFSET + 0x28)
      == os) {
    return (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

void write(Span<const std::byte> src) { GetStream().write(src); }